

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.h
# Opt level: O0

etc1_solution_coordinates * __thiscall
crnlib::etc1_solution_coordinates::operator=
          (etc1_solution_coordinates *this,etc1_solution_coordinates *rhs)

{
  etc1_solution_coordinates *rhs_local;
  etc1_solution_coordinates *this_local;
  
  color_quad<unsigned_char,_int>::operator=(&this->m_unscaled_color,&rhs->m_unscaled_color);
  this->m_inten_table = rhs->m_inten_table;
  this->m_color4 = (bool)(rhs->m_color4 & 1);
  return this;
}

Assistant:

inline etc1_solution_coordinates& operator=(const etc1_solution_coordinates& rhs)
        {
            m_unscaled_color = rhs.m_unscaled_color;
            m_inten_table = rhs.m_inten_table;
            m_color4 = rhs.m_color4;
            return *this;
        }